

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

int __thiscall
Fl_Tree::select(Fl_Tree *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
               timeval *__timeout)

{
  uint *puVar1;
  int iVar2;
  undefined4 in_register_00000034;
  
  iVar2 = 0;
  if (*(char *)(CONCAT44(in_register_00000034,__nfds) + 0x1b) == '\0') {
    *(undefined1 *)(CONCAT44(in_register_00000034,__nfds) + 0x1b) = 1;
    puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    if ((int)__readfds != 0) {
      do_callback_for_item
                (this,(Fl_Tree_Item *)CONCAT44(in_register_00000034,__nfds),FL_TREE_REASON_SELECTED)
      ;
    }
    iVar2 = 1;
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  return iVar2;
}

Assistant:

int Fl_Tree::select(Fl_Tree_Item *item, int docallback) {
  int alreadySelected = item->is_selected();
  if ( !alreadySelected ) {
    item->select();
    set_changed();
    if ( docallback ) {
      do_callback_for_item(item, FL_TREE_REASON_SELECTED);
    }
    redraw();
    return(1);
  }
#if FLTK_ABI_VERSION >= 10301
  // NEW
  if ( alreadySelected ) {
    if ( (item_reselect_mode() == FL_TREE_SELECTABLE_ALWAYS) && docallback ) {
      do_callback_for_item(item, FL_TREE_REASON_RESELECTED);
    }
  }
#endif /*FLTK_ABI_VERSION*/
  return(0);
}